

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

int mime_file_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  FILE *__stream;
  
  __stream = *(FILE **)((long)instream + 0x48);
  if (offset == 0 && whence == 0) {
    if (__stream == (FILE *)0x0) {
      return 0;
    }
  }
  else if (__stream == (FILE *)0x0) {
    __stream = fopen64(*(char **)((long)instream + 0x20),"rb");
    *(FILE **)((long)instream + 0x48) = __stream;
    if (__stream == (FILE *)0x0) {
      return 1;
    }
  }
  iVar1 = fseek(__stream,offset,whence);
  return (uint)(iVar1 != 0) * 2;
}

Assistant:

static int mime_file_seek(void *instream, curl_off_t offset, int whence)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  if(whence == SEEK_SET && !offset && !part->fp)
    return CURL_SEEKFUNC_OK;   /* Not open: implicitly already at BOF. */

  if(mime_open_file(part))
    return CURL_SEEKFUNC_FAIL;

  return fseek(part->fp, (long) offset, whence)?
               CURL_SEEKFUNC_CANTSEEK: CURL_SEEKFUNC_OK;
}